

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O0

void assetsys_internal_remove_collated(assetsys_t *sys,int index)

{
  assetsys_internal_collated_t *paVar1;
  assetsys_internal_collated_t *coll;
  int index_local;
  assetsys_t *sys_local;
  
  paVar1 = sys->collated + index;
  if (0 < paVar1->ref_count) {
    paVar1->ref_count = paVar1->ref_count + -1;
    if (paVar1->ref_count == 0) {
      strpool_decref(&sys->strpool,paVar1->path);
      strpool_discard(&sys->strpool,paVar1->path);
    }
    return;
  }
  __assert_fail("coll->ref_count > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/mattiasgustavsson_libs/assetsys.h"
                ,0x1798,"void assetsys_internal_remove_collated(assetsys_t *, const int)");
}

Assistant:

static void assetsys_internal_remove_collated( assetsys_t* sys, int const index )
    {
    struct assetsys_internal_collated_t* coll = &sys->collated[ index ];
    ASSETSYS_ASSERT( coll->ref_count > 0 );
    --coll->ref_count;
    if( coll->ref_count == 0 )
        {
        strpool_decref( &sys->strpool, coll->path );
        strpool_discard( &sys->strpool, coll->path );
        }
    }